

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t id_00;
  uint32_t id_01;
  ID id_02;
  bool bVar1;
  byte bVar2;
  uint32_t *puVar3;
  SPIRAccessChain *chain;
  SPIRType *pSVar4;
  iterator iVar5;
  SPIRExpression *e;
  uint32_t id;
  allocator local_71;
  string load_expr;
  string local_50;
  
  puVar3 = Compiler::stream((Compiler *)this,instruction);
  chain = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,puVar3[2]);
  if (chain == (SPIRAccessChain *)0x0) {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
    return;
  }
  id_00 = *puVar3;
  id_01 = puVar3[1];
  id_02.id = puVar3[2];
  id = id_01;
  bVar1 = Compiler::has_decoration((Compiler *)this,id_02,DecorationNonUniform);
  if (bVar1) {
    CompilerGLSL::propagate_nonuniform_qualifier(&this->super_CompilerGLSL,id_02.id);
  }
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id_00);
  if (((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0) &&
     (*(int *)&(pSVar4->super_IVariant).field_0xc != 0xf)) {
    load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
    load_expr._M_string_length = 0;
    load_expr.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::string((string *)&local_50,"",&local_71);
    read_access_chain(this,&load_expr,&local_50,chain);
    ::std::__cxx11::string::~string((string *)&local_50);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,id_02.id);
    if ((bVar1) &&
       (iVar5 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h,&id),
       iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
      bVar2 = 1;
    }
    else {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      bVar2 = 0;
    }
    bVar1 = (bool)(pSVar4->columns < 2 & bVar2);
    e = CompilerGLSL::emit_op(&this->super_CompilerGLSL,id_00,id,&load_expr,bVar1,true);
    e->need_transpose = false;
    Compiler::register_read((Compiler *)this,id,id_02.id,bVar1);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,id_02.id);
    if (bVar1 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(chain->super_IVariant).self.id);
    }
    ::std::__cxx11::string::~string((string *)&load_expr);
    return;
  }
  CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,id_00,id_01);
  CompilerGLSL::to_expression_abi_cxx11_(&load_expr,&this->super_CompilerGLSL,id_01,true);
  read_access_chain(this,(string *)0x0,&load_expr,chain);
  ::std::__cxx11::string::~string((string *)&load_expr);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
	if (chain)
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		uint32_t ptr = ops[2];

		if (has_decoration(ptr, DecorationNonUniformEXT))
			propagate_nonuniform_qualifier(ptr);

		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
		CompilerGLSL::emit_instruction(instruction);
}